

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf262.c
# Opt level: O0

void ymf262_reset_chip(void *chip)

{
  void *chip_local;
  
  OPL3ResetChip((OPL3 *)chip);
  return;
}

Assistant:

void ymf262_reset_chip(void *chip)
{
	OPL3ResetChip((OPL3 *)chip);
}